

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

void __thiscall FxConditional::~FxConditional(FxConditional *this)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConditional_00867a00;
  if (this->condition != (FxExpression *)0x0) {
    (*this->condition->_vptr_FxExpression[1])();
    this->condition = (FxExpression *)0x0;
  }
  if (this->truex != (FxExpression *)0x0) {
    (*this->truex->_vptr_FxExpression[1])();
    this->truex = (FxExpression *)0x0;
  }
  if (this->falsex != (FxExpression *)0x0) {
    (*this->falsex->_vptr_FxExpression[1])();
    this->falsex = (FxExpression *)0x0;
  }
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00868270;
  FString::~FString(&(this->super_FxExpression).ScriptPosition.FileName);
  TArray<FxJumpStatement_*,_FxJumpStatement_*>::~TArray(&(this->super_FxExpression).JumpAddresses);
  return;
}

Assistant:

FxConditional::~FxConditional()
{
	SAFE_DELETE(condition);
	SAFE_DELETE(truex);
	SAFE_DELETE(falsex);
}